

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O3

MatrixXd *
ear::toPositionsMatrix
          (MatrixXd *__return_storage_ptr__,
          vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> *positions)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  pointer pPVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double local_38 [3];
  
  lVar11 = (long)(positions->
                 super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(positions->
                 super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  if (lVar11 < -0x17) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  lVar11 = lVar11 >> 3;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,lVar11,
             lVar11 * -0x5555555555555555,3);
  pPVar8 = (positions->super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((positions->super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>).
      _M_impl.super__Vector_impl_data._M_finish != pPVar8) {
    uVar12 = 0;
    do {
      dVar1 = pPVar8[uVar12].elevation;
      dVar2 = pPVar8[uVar12].distance;
      dVar4 = pPVar8[uVar12].azimuth * -0.017453292519943295;
      dVar5 = sin(dVar4);
      dVar1 = dVar1 * 0.017453292519943295;
      dVar6 = cos(dVar1);
      dVar4 = cos(dVar4);
      dVar7 = cos(dVar1);
      dVar1 = sin(dVar1);
      local_38[0] = dVar2 * dVar6 * dVar5;
      local_38[1] = dVar2 * dVar7 * dVar4;
      local_38[2] = dVar1 * dVar2;
      pdVar9 = (__return_storage_ptr__->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
      lVar11 = (__return_storage_ptr__->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
      if (lVar11 < 0 && pdVar9 != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                     );
      }
      lVar3 = (__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      if (lVar3 <= (long)uVar12) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      if (lVar11 != 3) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseBase.h"
                      ,0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>]"
                     );
      }
      pdVar9 = pdVar9 + uVar12;
      lVar11 = 0;
      do {
        *pdVar9 = local_38[lVar11];
        lVar11 = lVar11 + 1;
        pdVar9 = pdVar9 + lVar3;
      } while (lVar11 != 3);
      uVar12 = (ulong)((int)uVar12 + 1);
      pPVar8 = (positions->
               super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = ((long)(positions->
                      super__Vector_base<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >> 3) *
               -0x5555555555555555;
    } while (uVar12 <= uVar10 && uVar10 - uVar12 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd toPositionsMatrix(
      const std::vector<PolarPosition>& positions) {
    Eigen::MatrixXd ret(positions.size(), 3);
    for (unsigned int i = 0; i < positions.size(); ++i) {
      ret.row(i) = toCartesianVector3d(positions[i]);
    }
    return ret;
  }